

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O0

int __thiscall ncnn::Gemm_x86_fma::create_pipeline(Gemm_x86_fma *this,Option *opt)

{
  int iVar1;
  float fVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  undefined8 *puVar7;
  long *plVar8;
  byte *in_RSI;
  long *in_RDI;
  bool bVar9;
  int in_stack_00000088;
  int in_stack_0000008c;
  int in_stack_00000090;
  int in_stack_00000094;
  Mat *in_stack_00000098;
  Mat *in_stack_000000a0;
  int i_1;
  int size;
  Mat C2;
  int C_elempack;
  Mat BT_tile;
  int max_kk_1;
  int max_jj;
  int k_1;
  int j;
  int ppk;
  int ppj_1;
  int ppjk;
  int nn_NK;
  int nn_K;
  int nn_N;
  int TILE_K_1;
  int TILE_N_1;
  int TILE_M_1;
  int K_1;
  int N;
  Mat AT_tile;
  int max_kk;
  int max_ii;
  int k;
  int i;
  int ppj;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int K;
  int M;
  Mat *m_1;
  Mat *m;
  undefined4 in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e4;
  Mat *in_stack_fffffffffffff8e8;
  Mat *in_stack_fffffffffffff8f0;
  void **ppvVar10;
  Option *in_stack_fffffffffffff8f8;
  Mat *in_stack_fffffffffffff900;
  void **ppvVar11;
  Mat *in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  undefined4 local_6c4;
  undefined8 in_stack_fffffffffffff940;
  long *plVar12;
  undefined8 in_stack_fffffffffffff948;
  long *plVar13;
  undefined8 in_stack_fffffffffffff950;
  int *in_stack_fffffffffffff960;
  int *in_stack_fffffffffffff968;
  int *in_stack_fffffffffffff970;
  int iVar14;
  undefined8 in_stack_fffffffffffff978;
  int local_5f8;
  void *local_5f0;
  int *local_5e8;
  void *local_5e0;
  undefined4 local_5d8;
  long *local_5d0;
  undefined4 local_5c8;
  undefined4 local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  void *local_5b0;
  undefined4 local_5a4;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined8 local_590;
  undefined4 local_588;
  long *local_580;
  undefined4 local_578;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined8 local_560;
  void *local_558;
  int *local_550;
  long local_548;
  undefined4 local_540;
  long *local_538;
  undefined4 local_530;
  int local_52c;
  undefined4 local_528;
  undefined4 local_524;
  undefined4 local_520;
  long local_518;
  int local_510;
  int local_50c;
  int local_508;
  int local_504;
  int local_500;
  int local_4fc;
  int local_4f8;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  int local_4dc [2];
  int local_4d4;
  int local_4d0;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  long *local_4a0;
  undefined4 local_498;
  undefined4 local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  undefined8 local_480;
  void *local_478;
  int *local_470;
  long local_468;
  undefined4 local_460;
  long *local_458;
  undefined4 local_450;
  int local_44c;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  long local_438;
  int local_42c;
  int local_428;
  int local_424;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  int local_410;
  int local_40c [2];
  int local_404;
  int local_400;
  int local_3fc;
  byte *local_3f8;
  void **local_3e0;
  undefined8 *local_3d8;
  void **local_3c8;
  undefined8 *local_3b8;
  undefined8 in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  Mat *in_stack_fffffffffffffc68;
  Mat *in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  int in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  Mat *in_stack_fffffffffffffd70;
  Mat *in_stack_fffffffffffffd78;
  
  iVar14 = (int)in_stack_fffffffffffff978;
  local_3f8 = in_RSI;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 0) {
    local_3fc = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
    local_400 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4);
    in_stack_fffffffffffff8e0 = *(undefined4 *)(in_RSI + 4);
    get_optimal_tile_mnk
              ((int)((ulong)in_stack_fffffffffffff950 >> 0x20),(int)in_stack_fffffffffffff950,
               (int)((ulong)in_stack_fffffffffffff948 >> 0x20),(int)in_stack_fffffffffffff948,
               (int)((ulong)in_stack_fffffffffffff940 >> 0x20),(int)in_stack_fffffffffffff940,
               in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff970,iVar14)
    ;
    local_410 = (local_3fc + local_404 + -1) / local_404;
    Mat::create(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                (int)in_stack_fffffffffffff8f8,(int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),
                (size_t)in_stack_fffffffffffff8e8,
                (Allocator *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    bVar9 = true;
    if (in_RDI[2] != 0) {
      bVar9 = in_RDI[10] * (long)(int)in_RDI[9] == 0;
    }
    if (bVar9) {
      return -100;
    }
    for (local_414 = 0; iVar14 = (int)in_stack_fffffffffffff978, local_414 < local_410;
        local_414 = local_414 + 1) {
      local_418 = local_414 * local_404;
      for (local_41c = 0; local_41c < local_400; local_41c = local_40c[0] + local_41c) {
        local_424 = local_3fc - local_418;
        piVar6 = std::min<int>(&local_424,&local_404);
        local_420 = *piVar6;
        local_42c = local_400 - local_41c;
        piVar6 = std::min<int>(&local_42c,local_40c);
        local_428 = *piVar6;
        local_44c = *(int *)((long)in_RDI + 0x3c);
        local_468 = in_RDI[4];
        local_460 = (undefined4)in_RDI[5];
        local_4a0 = (long *)in_RDI[6];
        local_478 = (void *)(in_RDI[2] + in_RDI[10] * (long)(local_418 / local_404) * in_RDI[4] +
                            (long)local_44c * (long)(local_41c / local_40c[0]) * local_468);
        local_438 = (long)local_44c;
        local_3d8 = &local_4c0;
        local_440 = 1;
        local_444 = 1;
        local_448 = 1;
        local_450 = 2;
        local_470 = (int *)0x0;
        local_4c0 = 0;
        local_4b0 = 0;
        local_4a8 = 0;
        local_498 = 0;
        local_494 = 0;
        local_490 = 0;
        local_48c = 0;
        local_488 = 0;
        local_480 = 0;
        local_4b8 = 0;
        local_458 = local_4a0;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0) {
          pack_A_tile(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc64,
                      in_stack_fffffffffffffc60,(int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                      (int)in_stack_fffffffffffffc58);
        }
        else {
          transpose_pack_A_tile
                    (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                     in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
        }
        local_3c8 = &local_478;
        if (local_470 != (int *)0x0) {
          LOCK();
          iVar14 = *local_470;
          *local_470 = *local_470 + -1;
          UNLOCK();
          if (iVar14 == 1) {
            if (local_458 == (long *)0x0) {
              if (local_478 != (void *)0x0) {
                free(local_478);
              }
            }
            else {
              (**(code **)(*local_458 + 0x18))(local_458,local_478);
            }
          }
        }
        local_478 = (void *)0x0;
        local_468 = 0;
        local_460 = 0;
        local_450 = 0;
        local_44c = 0;
        local_448 = 0;
        local_444 = 0;
        local_440 = 0;
        local_438 = 0;
        local_470 = (int *)0x0;
      }
    }
    if ((*local_3f8 & 1) != 0) {
      lVar3 = *(long *)(*in_RDI + -0x18);
      puVar7 = (undefined8 *)((long)in_RDI + lVar3 + 0x118);
      if (*(long *)((long)in_RDI + lVar3 + 0x120) != 0) {
        piVar6 = *(int **)((long)in_RDI + lVar3 + 0x120);
        LOCK();
        iVar1 = *piVar6;
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (*(long *)((long)in_RDI + lVar3 + 0x138) == 0) {
            if ((void *)*puVar7 != (void *)0x0) {
              free((void *)*puVar7);
            }
          }
          else {
            plVar8 = *(long **)((long)in_RDI + lVar3 + 0x138);
            (**(code **)(*plVar8 + 0x18))(plVar8,*puVar7);
          }
        }
      }
      *puVar7 = 0;
      *(undefined8 *)((long)in_RDI + lVar3 + 0x128) = 0;
      *(undefined4 *)((long)in_RDI + lVar3 + 0x130) = 0;
      *(undefined4 *)((long)in_RDI + lVar3 + 0x140) = 0;
      *(undefined4 *)((long)in_RDI + lVar3 + 0x144) = 0;
      *(undefined4 *)((long)in_RDI + lVar3 + 0x148) = 0;
      *(undefined4 *)((long)in_RDI + lVar3 + 0x14c) = 0;
      *(undefined4 *)((long)in_RDI + lVar3 + 0x150) = 0;
      *(undefined8 *)((long)in_RDI + lVar3 + 0x158) = 0;
      *(undefined8 *)((long)in_RDI + lVar3 + 0x120) = 0;
    }
  }
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 0) {
    local_4d0 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
    local_4d4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4);
    in_stack_fffffffffffff8e0 = *(undefined4 *)(local_3f8 + 4);
    get_optimal_tile_mnk
              ((int)((ulong)in_stack_fffffffffffff950 >> 0x20),(int)in_stack_fffffffffffff950,
               (int)((ulong)in_stack_fffffffffffff948 >> 0x20),(int)in_stack_fffffffffffff948,
               (int)((ulong)in_stack_fffffffffffff940 >> 0x20),(int)in_stack_fffffffffffff940,
               in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff970,iVar14)
    ;
    local_4e4 = (local_4d0 + local_4dc[0] + -1) / local_4dc[0];
    local_4e8 = (local_4d4 + local_4e0 + -1) / local_4e0;
    Mat::create(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                (int)in_stack_fffffffffffff8f8,(int)((ulong)in_stack_fffffffffffff8f0 >> 0x20),
                (size_t)in_stack_fffffffffffff8e8,
                (Allocator *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    bVar9 = true;
    if (in_RDI[0xb] != 0) {
      bVar9 = in_RDI[0x13] * (long)(int)in_RDI[0x12] == 0;
    }
    if (bVar9) {
      return -100;
    }
    local_4ec = local_4e4 * local_4e8;
    for (local_4f0 = 0; local_4f0 < local_4ec; local_4f0 = local_4f0 + 1) {
      local_4f4 = local_4f0 / local_4e8;
      local_4f8 = local_4f0 % local_4e8;
      local_4fc = local_4f4 * local_4dc[0];
      local_500 = local_4f8 * local_4e0;
      local_508 = local_4d0 - local_4fc;
      piVar6 = std::min<int>(&local_508,local_4dc);
      local_504 = *piVar6;
      local_510 = local_4d4 - local_500;
      piVar6 = std::min<int>(&local_510,&local_4e0);
      local_50c = *piVar6;
      local_52c = *(int *)((long)in_RDI + 0x84);
      local_548 = in_RDI[0xd];
      local_540 = (undefined4)in_RDI[0xe];
      local_580 = (long *)in_RDI[0xf];
      local_558 = (void *)(in_RDI[0xb] +
                           in_RDI[0x13] * (long)(local_4fc / local_4dc[0]) * in_RDI[0xd] +
                          (long)local_52c * (long)(local_500 / local_4e0) * local_548);
      local_518 = (long)local_52c;
      local_3b8 = &local_5a0;
      local_520 = 1;
      local_524 = 1;
      local_528 = 1;
      local_530 = 2;
      local_550 = (int *)0x0;
      local_5a0 = 0;
      local_590 = 0;
      local_588 = 0;
      local_578 = 0;
      local_574 = 0;
      local_570 = 0;
      local_56c = 0;
      local_568 = 0;
      local_560 = 0;
      local_598 = 0;
      local_538 = local_580;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0) {
        transpose_pack_B_tile
                  (in_stack_000000a0,in_stack_00000098,in_stack_00000094,in_stack_00000090,
                   in_stack_0000008c,in_stack_00000088);
      }
      else {
        pack_B_tile((Mat *)C2.allocator,(Mat *)C2._24_8_,C2.elemsize._4_4_,(int)C2.elemsize,
                    C2.refcount._4_4_,(int)C2.refcount);
      }
      if (local_550 != (int *)0x0) {
        LOCK();
        iVar14 = *local_550;
        *local_550 = *local_550 + -1;
        UNLOCK();
        if (iVar14 == 1) {
          if (local_538 == (long *)0x0) {
            if (local_558 != (void *)0x0) {
              free(local_558);
            }
          }
          else {
            (**(code **)(*local_538 + 0x18))(local_538,local_558);
          }
        }
      }
      local_558 = (void *)0x0;
      local_548 = 0;
      local_540 = 0;
      local_530 = 0;
      local_52c = 0;
      local_528 = 0;
      local_524 = 0;
      local_520 = 0;
      local_518 = 0;
      local_550 = (int *)0x0;
    }
    if ((*local_3f8 & 1) != 0) {
      lVar3 = *(long *)(*in_RDI + -0x18);
      puVar7 = (undefined8 *)((long)in_RDI + lVar3 + 0x160);
      if (*(long *)((long)in_RDI + lVar3 + 0x168) != 0) {
        piVar6 = *(int **)((long)in_RDI + lVar3 + 0x168);
        LOCK();
        iVar14 = *piVar6;
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (iVar14 == 1) {
          if (*(long *)((long)in_RDI + lVar3 + 0x180) == 0) {
            if ((void *)*puVar7 != (void *)0x0) {
              free((void *)*puVar7);
            }
          }
          else {
            plVar8 = *(long **)((long)in_RDI + lVar3 + 0x180);
            (**(code **)(*plVar8 + 0x18))(plVar8,*puVar7);
          }
        }
      }
      *puVar7 = 0;
      puVar7[2] = 0;
      *(undefined4 *)(puVar7 + 3) = 0;
      *(undefined4 *)(puVar7 + 5) = 0;
      *(undefined4 *)((long)puVar7 + 0x2c) = 0;
      *(undefined4 *)(puVar7 + 6) = 0;
      *(undefined4 *)((long)puVar7 + 0x34) = 0;
      *(undefined4 *)(puVar7 + 7) = 0;
      puVar7[8] = 0;
      puVar7[1] = 0;
    }
  }
  iVar14 = (int)((ulong)in_stack_fffffffffffff900 >> 0x20);
  if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 0) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) != -1)) {
    lVar3 = *(long *)(*in_RDI + -0x18);
    plVar8 = (long *)((long)in_RDI + lVar3 + 0x1a8);
    plVar12 = in_RDI + 0x14;
    if (plVar12 != plVar8) {
      if (*(long *)((long)in_RDI + lVar3 + 0x1b0) != 0) {
        piVar6 = *(int **)((long)in_RDI + lVar3 + 0x1b0);
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      plVar13 = plVar12;
      if (in_RDI[0x15] != 0) {
        piVar6 = (int *)in_RDI[0x15];
        LOCK();
        iVar1 = *piVar6;
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (in_RDI[0x18] == 0) {
            if ((void *)*plVar12 != (void *)0x0) {
              free((void *)*plVar12);
            }
          }
          else {
            (**(code **)(*(long *)in_RDI[0x18] + 0x18))((long *)in_RDI[0x18],*plVar12);
          }
        }
      }
      *plVar12 = 0;
      plVar12[2] = 0;
      *(undefined4 *)(plVar12 + 3) = 0;
      *(undefined4 *)(plVar12 + 5) = 0;
      *(undefined4 *)((long)plVar12 + 0x2c) = 0;
      *(undefined4 *)(plVar12 + 6) = 0;
      *(undefined4 *)((long)plVar12 + 0x34) = 0;
      *(undefined4 *)(plVar12 + 7) = 0;
      plVar12[8] = 0;
      plVar12[1] = 0;
      *plVar13 = *plVar8;
      plVar13[1] = *(long *)((long)in_RDI + lVar3 + 0x1b0);
      plVar13[2] = *(long *)((long)in_RDI + lVar3 + 0x1b8);
      *(undefined4 *)(plVar13 + 3) = *(undefined4 *)((long)in_RDI + lVar3 + 0x1c0);
      plVar13[4] = *(long *)((long)in_RDI + lVar3 + 0x1c8);
      *(undefined4 *)(plVar13 + 5) = *(undefined4 *)((long)in_RDI + lVar3 + 0x1d0);
      *(undefined4 *)((long)plVar13 + 0x2c) = *(undefined4 *)((long)in_RDI + lVar3 + 0x1d4);
      *(undefined4 *)(plVar13 + 6) = *(undefined4 *)((long)in_RDI + lVar3 + 0x1d8);
      *(undefined4 *)((long)plVar13 + 0x34) = *(undefined4 *)((long)in_RDI + lVar3 + 0x1dc);
      *(undefined4 *)(plVar13 + 7) = *(undefined4 *)((long)in_RDI + lVar3 + 0x1e0);
      plVar13[8] = *(long *)((long)in_RDI + lVar3 + 0x1e8);
    }
    if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) == 3) &&
       ((local_3f8[0x27] & 1) != 0)) {
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) % 8 == 0) {
        local_6c4 = 8;
      }
      else {
        local_6c4 = 1;
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) % 4 == 0) {
          local_6c4 = 4;
        }
      }
      local_5a4 = local_6c4;
      convert_packing((Mat *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                      in_stack_fffffffffffff908,iVar14,in_stack_fffffffffffff8f8);
    }
    fVar2 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    if ((fVar2 != 1.0) || (NAN(fVar2))) {
      local_3e0 = &local_5f0;
      local_5f0 = (void *)0x0;
      local_5e8 = (int *)0x0;
      local_5e0 = (void *)0x0;
      local_5d8 = 0;
      local_5d0 = (long *)0x0;
      local_5c8 = 0;
      local_5c4 = 0;
      local_5c0 = 0;
      local_5bc = 0;
      local_5b8 = 0;
      local_5b0 = (void *)0x0;
      Mat::create_like(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                       (Allocator *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      lVar3 = in_RDI[0x1c];
      lVar4 = in_RDI[0x1b];
      lVar5 = in_RDI[0x17];
      for (local_5f8 = 0; local_5f8 < (int)lVar3 * (int)lVar4 * (int)lVar5;
          local_5f8 = local_5f8 + 1) {
        *(float *)((long)local_5f0 + (long)local_5f8 * 4) =
             *(float *)(in_RDI[0x14] + (long)local_5f8 * 4) *
             *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      }
      ppvVar10 = (void **)(in_RDI + 0x14);
      if (ppvVar10 != &local_5f0) {
        if (local_5e8 != (int *)0x0) {
          LOCK();
          *local_5e8 = *local_5e8 + 1;
          UNLOCK();
        }
        ppvVar11 = ppvVar10;
        if (in_RDI[0x15] != 0) {
          piVar6 = (int *)in_RDI[0x15];
          LOCK();
          iVar14 = *piVar6;
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (iVar14 == 1) {
            if (in_RDI[0x18] == 0) {
              if (*ppvVar10 != (void *)0x0) {
                free(*ppvVar10);
              }
            }
            else {
              (**(code **)(*(long *)in_RDI[0x18] + 0x18))((long *)in_RDI[0x18],*ppvVar10);
            }
          }
        }
        *ppvVar10 = (void *)0x0;
        ppvVar10[2] = (void *)0x0;
        *(undefined4 *)(ppvVar10 + 3) = 0;
        *(undefined4 *)(ppvVar10 + 5) = 0;
        *(undefined4 *)((long)ppvVar10 + 0x2c) = 0;
        *(undefined4 *)(ppvVar10 + 6) = 0;
        *(undefined4 *)((long)ppvVar10 + 0x34) = 0;
        *(undefined4 *)(ppvVar10 + 7) = 0;
        ppvVar10[8] = (void *)0x0;
        ppvVar10[1] = (void *)0x0;
        *ppvVar11 = local_5f0;
        ppvVar11[1] = local_5e8;
        ppvVar11[2] = local_5e0;
        *(undefined4 *)(ppvVar11 + 3) = local_5d8;
        ppvVar11[4] = local_5d0;
        *(undefined4 *)(ppvVar11 + 5) = local_5c8;
        *(undefined4 *)((long)ppvVar11 + 0x2c) = local_5c4;
        *(undefined4 *)(ppvVar11 + 6) = local_5c0;
        *(undefined4 *)((long)ppvVar11 + 0x34) = local_5bc;
        *(undefined4 *)(ppvVar11 + 7) = local_5b8;
        ppvVar11[8] = local_5b0;
      }
      ppvVar10 = &local_5f0;
      if (local_5e8 != (int *)0x0) {
        LOCK();
        iVar14 = *local_5e8;
        *local_5e8 = *local_5e8 + -1;
        UNLOCK();
        if (iVar14 == 1) {
          if (local_5d0 == (long *)0x0) {
            if (local_5f0 != (void *)0x0) {
              free(local_5f0);
            }
          }
          else {
            (**(code **)(*local_5d0 + 0x18))(local_5d0,local_5f0);
          }
        }
      }
      *ppvVar10 = (void *)0x0;
      ppvVar10[2] = (void *)0x0;
      *(undefined4 *)(ppvVar10 + 3) = 0;
      *(undefined4 *)(ppvVar10 + 5) = 0;
      *(undefined4 *)((long)ppvVar10 + 0x2c) = 0;
      *(undefined4 *)(ppvVar10 + 6) = 0;
      *(undefined4 *)((long)ppvVar10 + 0x34) = 0;
      *(undefined4 *)(ppvVar10 + 7) = 0;
      ppvVar10[8] = (void *)0x0;
      ppvVar10[1] = (void *)0x0;
    }
    if ((*local_3f8 & 1) != 0) {
      lVar3 = *(long *)(*in_RDI + -0x18);
      puVar7 = (undefined8 *)((long)in_RDI + lVar3 + 0x1a8);
      if (*(long *)((long)in_RDI + lVar3 + 0x1b0) != 0) {
        piVar6 = *(int **)((long)in_RDI + lVar3 + 0x1b0);
        LOCK();
        iVar14 = *piVar6;
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (iVar14 == 1) {
          if (*(long *)((long)in_RDI + lVar3 + 0x1c8) == 0) {
            if ((void *)*puVar7 != (void *)0x0) {
              free((void *)*puVar7);
            }
          }
          else {
            plVar8 = *(long **)((long)in_RDI + lVar3 + 0x1c8);
            (**(code **)(*plVar8 + 0x18))(plVar8,*puVar7);
          }
        }
      }
      *puVar7 = 0;
      puVar7[2] = 0;
      *(undefined4 *)(puVar7 + 3) = 0;
      *(undefined4 *)(puVar7 + 5) = 0;
      *(undefined4 *)((long)puVar7 + 0x2c) = 0;
      *(undefined4 *)(puVar7 + 6) = 0;
      *(undefined4 *)((long)puVar7 + 0x34) = 0;
      *(undefined4 *)(puVar7 + 7) = 0;
      puVar7[8] = 0;
      puVar7[1] = 0;
    }
  }
  if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 0) ||
      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 0)) ||
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 0)) {
    *(undefined4 *)(in_RDI + 1) = *(undefined4 *)(local_3f8 + 4);
  }
  return 0;
}

Assistant:

int Gemm_x86_fma::create_pipeline(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

        AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
        {
            A_data.release();
        }
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;
        const int nn_K = (K + TILE_K - 1) / TILE_K;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        const int nn_NK = nn_N * nn_K;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

            if (transB)
            {
                pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
            else
            {
                transpose_pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
        }

        if (opt.lightmode)
        {
            B_data.release();
        }
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

#if __SSE2__
        if (constant_broadcast_type_C == 3 && opt.use_packing_layout)
        {
#if __AVX512F__
            int C_elempack = constantM % 16 == 0 ? 16 : constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#elif __AVX__
            int C_elempack = constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#else
            int C_elempack = constantM % 4 == 0 ? 4 : 1;
#endif
            convert_packing(C_data, CT_data, C_elempack, opt);
        }
#endif // __SSE2__

        // pre-multiply C with beta
        if (beta != 1.f)
        {
            Mat C2;
            C2.create_like(CT_data);

            const int size = CT_data.total() * CT_data.elempack;
            for (int i = 0; i < size; i++)
            {
                C2[i] = CT_data[i] * beta;
            }

            CT_data = C2;
        }

        if (opt.lightmode)
        {
            C_data.release();
        }
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}